

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O3

HighsStatus __thiscall
HighsIis::getData(HighsIis *this,HighsLp *lp,HighsOptions *options,HighsBasis *basis,
                 vector<int,_std::allocator<int>_> *infeasible_row)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer pbVar4;
  pointer pbVar5;
  HighsIis *pHVar6;
  int iVar7;
  HighsStatus HVar8;
  uint uVar9;
  long lVar10;
  double *pdVar11;
  HighsStatus HVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  vector<int,_std::allocator<int>_> from_col;
  vector<int,_std::allocator<int>_> from_row;
  vector<int,_std::allocator<int>_> to_row;
  HighsLp to_lp;
  void *local_448;
  iterator iStack_440;
  int *local_438;
  ulong local_430;
  double local_428;
  vector<int,_std::allocator<int>_> local_420;
  vector<int,_std::allocator<int>_> local_408;
  HighsOptions *local_3f0;
  HighsIis *local_3e8;
  ulong local_3e0;
  pointer local_3d8;
  pointer local_3d0;
  undefined1 local_3c8 [40];
  iterator local_3a0;
  double *local_398;
  vector<double,std::allocator<double>> local_390 [8];
  iterator local_388;
  double *local_380;
  vector<double,std::allocator<double>> local_378 [8];
  iterator local_370;
  double *local_368;
  vector<double,std::allocator<double>> local_360 [8];
  iterator local_358;
  double *local_350;
  uint local_344;
  HighsInt local_340;
  vector<int,_std::allocator<int>_> local_338 [2];
  pointer local_308;
  iterator local_300;
  int *local_2f8;
  vector<double,std::allocator<double>> local_2f0 [8];
  iterator local_2e8;
  double *local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268 [23];
  
  std::vector<int,_std::allocator<int>_>::vector(&local_420,infeasible_row);
  local_438 = (int *)0x0;
  local_448 = (void *)0x0;
  iStack_440._M_current = (int *)0x0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_3c8._0_4_ = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&local_408,(long)lp->num_row_,(value_type_conflict2 *)local_3c8);
  piVar3 = (infeasible_row->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (uint)((ulong)((long)(infeasible_row->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
  if (0 < (int)uVar9) {
    uVar14 = 0;
    do {
      local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar3[uVar14]] = (int)uVar14;
      uVar14 = uVar14 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar14);
  }
  local_3c8._0_4_ = 0;
  if (lp->num_col_ < 1) {
    uVar9 = 0;
  }
  else {
    do {
      piVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar7 = piVar3[(int)local_3c8._0_4_];
      lVar10 = (long)iVar7;
      iVar2 = piVar3[(long)(int)local_3c8._0_4_ + 1];
      if (iVar7 < iVar2) {
        bVar15 = false;
        do {
          while (!bVar15) {
            piVar1 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar10;
            bVar15 = -1 < local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[*piVar1];
            lVar10 = lVar10 + 1;
            if (lVar10 == iVar2) {
              if (local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[*piVar1] < 0) goto LAB_002266b4;
              goto LAB_00226690;
            }
          }
          lVar10 = lVar10 + 1;
          bVar15 = true;
        } while (lVar10 != iVar2);
LAB_00226690:
        if (iStack_440._M_current == local_438) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_448,iStack_440,(int *)local_3c8);
        }
        else {
          *iStack_440._M_current = local_3c8._0_4_;
          iStack_440._M_current = iStack_440._M_current + 1;
        }
      }
LAB_002266b4:
      local_3c8._0_4_ = local_3c8._0_4_ + 1;
    } while ((int)local_3c8._0_4_ < lp->num_col_);
    uVar9 = (uint)((ulong)((long)iStack_440._M_current - (long)local_448) >> 2);
  }
  uVar14 = (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_3f0 = options;
  local_3e8 = this;
  HighsLp::HighsLp((HighsLp *)local_3c8);
  local_430 = uVar14 >> 2;
  local_3c8._4_4_ = (undefined4)local_430;
  local_3c8._0_4_ = uVar9;
  local_344 = uVar9;
  local_340 = local_3c8._4_4_;
  if (0 < (int)uVar9) {
    local_3d0 = (lp->col_names_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_3d8 = (lp->col_names_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_3e0 = (ulong)uVar9;
    uVar14 = 0;
    do {
      local_428 = 0.0;
      if (local_3c8._16_8_ == local_3c8._24_8_) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)(local_3c8 + 8),
                   (iterator)local_3c8._16_8_,&local_428);
      }
      else {
        *(double *)local_3c8._16_8_ = 0.0;
        local_3c8._16_8_ = local_3c8._16_8_ + 8;
      }
      lVar10 = (long)*(int *)((long)local_448 + uVar14 * 4);
      pdVar11 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10;
      if (local_3a0._M_current == local_398) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)(local_3c8 + 0x20),local_3a0,pdVar11);
        lVar10 = (long)*(int *)((long)local_448 + uVar14 * 4);
      }
      else {
        *local_3a0._M_current = *pdVar11;
        local_3a0._M_current = local_3a0._M_current + 1;
      }
      pdVar11 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10;
      if (local_388._M_current == local_380) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_390,local_388,pdVar11);
      }
      else {
        *local_388._M_current = *pdVar11;
        local_388._M_current = local_388._M_current + 1;
      }
      if (local_3d8 != local_3d0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_280,
                    (lp->col_names_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    *(int *)((long)local_448 + uVar14 * 4));
      }
      lVar10 = (long)*(int *)((long)local_448 + uVar14 * 4);
      piVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar7 = piVar3[lVar10];
      lVar13 = (long)iVar7;
      if (iVar7 < piVar3[lVar10 + 1]) {
        lVar10 = lVar13 * 8;
        do {
          iVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13];
          if (-1 < local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar7]) {
            if (local_300._M_current == local_2f8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_308,local_300,
                         local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar7);
            }
            else {
              *local_300._M_current =
                   local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar7];
              local_300._M_current = local_300._M_current + 1;
            }
            pdVar11 = (double *)
                      ((long)(lp->a_matrix_).value_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10);
            if (local_2e8._M_current == local_2e0) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_2f0,local_2e8,pdVar11);
            }
            else {
              *local_2e8._M_current = *pdVar11;
              local_2e8._M_current = local_2e8._M_current + 1;
            }
          }
          lVar13 = lVar13 + 1;
          lVar10 = lVar10 + 8;
        } while (lVar13 < (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [(long)*(int *)((long)local_448 + uVar14 * 4) + 1]);
      }
      iVar7 = (int)((ulong)((long)local_300._M_current - (long)local_308) >> 2);
      local_428 = (double)CONCAT44(local_428._4_4_,iVar7);
      if (local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_338,
                   (iterator)
                   local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_428);
      }
      else {
        *local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar7;
        local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_3e0);
  }
  if (0 < (int)(uint)local_430) {
    pbVar4 = (lp->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (lp->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_430 = (ulong)((uint)local_430 & 0x7fffffff);
    uVar14 = 0;
    do {
      lVar10 = (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
      pdVar11 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10;
      if (local_370._M_current == local_368) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_378,local_370,pdVar11);
        lVar10 = (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
      }
      else {
        *local_370._M_current = *pdVar11;
        local_370._M_current = local_370._M_current + 1;
      }
      pdVar11 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10;
      if (local_358._M_current == local_350) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_360,local_358,pdVar11);
      }
      else {
        *local_358._M_current = *pdVar11;
        local_358._M_current = local_358._M_current + 1;
      }
      if (pbVar5 != pbVar4) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_268,
                    (lp->row_names_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar14]);
      }
      uVar14 = uVar14 + 1;
    } while (local_430 != uVar14);
  }
  pHVar6 = local_3e8;
  HVar8 = compute(local_3e8,(HighsLp *)local_3c8,local_3f0,(HighsBasis *)0x0);
  HVar12 = kError;
  if (HVar8 == kOk) {
    piVar3 = (pHVar6->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (uint)((ulong)((long)(pHVar6->col_index_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
    if (0 < (int)uVar9) {
      uVar14 = 0;
      do {
        piVar3[uVar14] = *(int *)((long)local_448 + (long)piVar3[uVar14] * 4);
        uVar14 = uVar14 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar14);
    }
    piVar3 = (pHVar6->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (uint)((ulong)((long)(pHVar6->row_index_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
    if ((int)uVar9 < 1) {
      HVar12 = kOk;
    }
    else {
      HVar12 = kOk;
      uVar14 = 0;
      do {
        piVar3[uVar14] =
             local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[piVar3[uVar14]];
        uVar14 = uVar14 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar14);
    }
  }
  HighsLp::~HighsLp((HighsLp *)local_3c8);
  if (local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_448 != (void *)0x0) {
    operator_delete(local_448);
  }
  if (local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar12;
}

Assistant:

HighsStatus HighsIis::getData(const HighsLp& lp, const HighsOptions& options,
                              const HighsBasis& basis,
                              const std::vector<HighsInt>& infeasible_row) {
  // Check for trivial IIS should have been done earlier
  assert(!this->trivial(lp, options));
  // The number of infeasible rows must be positive
  assert(infeasible_row.size() > 0);
  // Identify the LP corresponding to the set of infeasible rows
  std::vector<HighsInt> from_row = infeasible_row;
  std::vector<HighsInt> from_col;
  std::vector<HighsInt> to_row;
  to_row.assign(lp.num_row_, -1);
  assert(lp.a_matrix_.isColwise());
  // Determine how to detect whether a row is in infeasible_row and
  // (then) gather information about it
  for (HighsInt iX = 0; iX < HighsInt(infeasible_row.size()); iX++)
    to_row[infeasible_row[iX]] = iX;
  // Identify the columns (from_col) with nonzeros in the infeasible
  // rows
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    bool use_col = false;
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++)
      use_col = use_col || to_row[lp.a_matrix_.index_[iEl]] >= 0;
    if (use_col) from_col.push_back(iCol);
  }
  HighsInt to_num_col = from_col.size();
  HighsInt to_num_row = from_row.size();
  HighsLp to_lp;
  to_lp.num_col_ = to_num_col;
  to_lp.num_row_ = to_num_row;
  to_lp.a_matrix_.num_col_ = to_lp.num_col_;
  to_lp.a_matrix_.num_row_ = to_lp.num_row_;
  const bool has_col_names = lp.col_names_.size() > 0;
  for (HighsInt iCol = 0; iCol < to_num_col; iCol++) {
    to_lp.col_cost_.push_back(0);
    to_lp.col_lower_.push_back(lp.col_lower_[from_col[iCol]]);
    to_lp.col_upper_.push_back(lp.col_upper_[from_col[iCol]]);
    if (has_col_names)
      to_lp.col_names_.push_back(lp.col_names_[from_col[iCol]]);
    for (HighsInt iEl = lp.a_matrix_.start_[from_col[iCol]];
         iEl < lp.a_matrix_.start_[from_col[iCol] + 1]; iEl++) {
      HighsInt iRow = lp.a_matrix_.index_[iEl];
      if (to_row[iRow] >= 0) {
        to_lp.a_matrix_.index_.push_back(to_row[iRow]);
        to_lp.a_matrix_.value_.push_back(lp.a_matrix_.value_[iEl]);
      }
    }
    to_lp.a_matrix_.start_.push_back(to_lp.a_matrix_.index_.size());
  }
  const bool has_row_names = lp.row_names_.size() > 0;
  for (HighsInt iRow = 0; iRow < to_num_row; iRow++) {
    to_lp.row_lower_.push_back(lp.row_lower_[from_row[iRow]]);
    to_lp.row_upper_.push_back(lp.row_upper_[from_row[iRow]]);
    if (has_row_names)
      to_lp.row_names_.push_back(lp.row_names_[from_row[iRow]]);
  }
  if (this->compute(to_lp, options) != HighsStatus::kOk)
    return HighsStatus::kError;
  // Indirect the values into the original LP
  for (HighsInt iCol = 0; iCol < HighsInt(this->col_index_.size()); iCol++)
    this->col_index_[iCol] = from_col[this->col_index_[iCol]];
  for (HighsInt iRow = 0; iRow < HighsInt(this->row_index_.size()); iRow++)
    this->row_index_[iRow] = from_row[this->row_index_[iRow]];
  if (kIisDevReport) this->report("On exit", lp);
  return HighsStatus::kOk;
}